

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_fifo.c
# Opt level: O2

int mk_fifo_queue_id_destroy(mk_fifo *ctx,int id)

{
  int iVar1;
  mk_fifo_queue *q;
  
  q = mk_fifo_queue_get(ctx,id);
  if (q == (mk_fifo_queue *)0x0) {
    iVar1 = -1;
  }
  else {
    mk_fifo_queue_destroy(ctx,q);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mk_fifo_queue_id_destroy(struct mk_fifo *ctx, int id)
{
    struct mk_fifo_queue *q;

    q = mk_fifo_queue_get(ctx, id);
    if (!q) {
        return -1;
    }

    mk_fifo_queue_destroy(ctx, q);
    return 0;
}